

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_gsr_fop_DDD(DisasContext_conflict8 *dc,int rd,int rs1,int rs2,
                    _func_void_TCGContext_ptr_TCGv_i32_TCGv_i32_TCGv_i32_TCGv_i32_conflict8 *gen)

{
  TCGContext_conflict8 *pTVar1;
  TCGv_i32 v;
  
  pTVar1 = dc->uc->tcg_ctx;
  v = *(TCGv_i32 *)((long)pTVar1->cpu_fpr + (ulong)(rd & 0x1eU | (rd & 1U) << 5) * 4);
  (*gen)(pTVar1,v,(TCGv_i32)pTVar1->cpu_gsr,
         *(TCGv_i32 *)((long)pTVar1->cpu_fpr + (ulong)(rs1 & 0x1eU | (rs1 & 1U) << 5) * 4),
         *(TCGv_i32 *)((long)pTVar1->cpu_fpr + (ulong)(rs2 & 0x1eU | (rs2 & 1U) << 5) * 4));
  gen_store_fpr_D(dc,rd,v);
  return;
}

Assistant:

static inline void gen_gsr_fop_DDD(DisasContext *dc, int rd, int rs1, int rs2,
                           void (*gen)(TCGContext *, TCGv_i64, TCGv_i64, TCGv_i64, TCGv_i64))
{
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;
    TCGv_i64 dst, src1, src2;

    src1 = gen_load_fpr_D(dc, rs1);
    src2 = gen_load_fpr_D(dc, rs2);
    dst = gen_dest_fpr_D(dc, rd);

    gen(tcg_ctx, dst, tcg_ctx->cpu_gsr, src1, src2);

    gen_store_fpr_D(dc, rd, dst);
}